

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

long passthrough_resampler_fill_short_input
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  void *pvVar1;
  bool bVar2;
  stringstream *psVar3;
  int line;
  long lVar4;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  local_68.ptr_._0_4_ = 0x20;
  local_48 = nframes;
  local_40 = nframes;
  local_38 = input_buffer;
  testing::internal::CmpHelperEQ<long,int>(local_60,"nframes","32",&local_40,(int *)&local_68);
  if (local_60[0] == (internal)0x0) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x3b0;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
LAB_0010b57a:
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    lVar4 = 0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar1 = local_38;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_60,"input[i]","0.01 * i",*(float *)((long)pvVar1 + lVar4 * 4),
                 (float)(int)lVar4 * 0.01);
      if (local_60[0] == (internal)0x0) {
        psVar3 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar3);
        *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_58.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x3b4;
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
        goto LAB_0010b57a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    lVar4 = 0;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_60,"input[i]","0.0",*(float *)((long)pvVar1 + lVar4 * 4 + 0x80),0.0);
      if (local_60[0] == (internal)0x0) {
        psVar3 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar3);
        *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_58.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x3b8;
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
        goto LAB_0010b57a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  return local_48;
}

Assistant:

static long
passthrough_resampler_fill_short_input(cubeb_stream * stream,
                                       void * user_ptr,
                                       void const * input_buffer,
                                       void * output_buffer,
                                       long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  [nframes, input_buffer]() {
    ASSERT_EQ(nframes, 32);
    const float* input = static_cast<const float*>(input_buffer);
    // First part contains the input
    for (int i = 0; i < 32; ++i) {
      ASSERT_FLOAT_EQ(input[i], 0.01 * i);
    }
    // missing part contains silence
    for (int i = 32; i < 64; ++i) {
      ASSERT_FLOAT_EQ(input[i], 0.0);
    }
  }();
  return nframes;
}